

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeJacobian
          (ChElementTetraCorot_10 *this,ChMatrixDynamic<> *Jacobian,double zeta1,double zeta2,
          double zeta3,double zeta4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  pointer psVar37;
  Scalar *pSVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  Scalar local_30;
  
  local_30 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)Jacobian,&local_30);
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = zeta1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)((long)&((psVar37->
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       zeta2 * *(double *)
                ((long)&(psVar37[4].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar39,auVar51,auVar1);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = zeta3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)((long)&(psVar37[6].
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar1,auVar52,auVar2);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = zeta4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)((long)&(psVar37[7].
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar1,auVar53,auVar3);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,1,0)
  ;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)&((psVar37->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->field_0x28;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       zeta2 * *(double *)
                &(psVar37[4].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar40,auVar54,auVar4);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = zeta3;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)&(psVar37[6].
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar1,auVar55,auVar5);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = zeta4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)&(psVar37[7].
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar1,auVar56,auVar6);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,2,0)
  ;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)&((psVar37->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->field_0x30;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       zeta2 * *(double *)
                &(psVar37[4].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar41,auVar57,auVar7);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = zeta3;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)&(psVar37[6].
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar1,auVar58,auVar8);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = zeta4;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)&(psVar37[7].
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar9);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,3,0)
  ;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(ulong *)((long)&(psVar37[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       zeta2 * *(double *)
                ((long)&(psVar37[1].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar42,auVar60,auVar10);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = zeta3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(ulong *)((long)&(psVar37[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar1,auVar61,auVar11);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = zeta4;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(ulong *)((long)&(psVar37[8].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar1,auVar62,auVar12);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,1,1)
  ;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(ulong *)&(psVar37[4].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       zeta2 * *(double *)
                &(psVar37[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar43,auVar63,auVar13);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = zeta3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(ulong *)&(psVar37[5].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar1,auVar64,auVar14);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = zeta4;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(ulong *)&(psVar37[8].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar1,auVar65,auVar15);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,2,1)
  ;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(ulong *)&(psVar37[4].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       zeta2 * *(double *)
                &(psVar37[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar44,auVar66,auVar16);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = zeta3;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       *(ulong *)&(psVar37[5].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar1,auVar67,auVar17);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = zeta4;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       *(ulong *)&(psVar37[8].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar1,auVar68,auVar18);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,3,1)
  ;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(ulong *)((long)&(psVar37[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       zeta2 * *(double *)
                ((long)&(psVar37[5].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar45,auVar69,auVar19);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = zeta3;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       *(ulong *)((long)&(psVar37[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar1,auVar70,auVar20);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = zeta4;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(ulong *)((long)&(psVar37[9].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar1,auVar71,auVar21);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,1,2)
  ;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       *(ulong *)&(psVar37[6].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       zeta2 * *(double *)
                &(psVar37[5].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar46,auVar72,auVar22);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = zeta3;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(ulong *)&(psVar37[2].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar1,auVar73,auVar23);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = zeta4;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(ulong *)&(psVar37[9].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar1,auVar74,auVar24);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,2,2)
  ;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(ulong *)&(psVar37[6].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       zeta2 * *(double *)
                &(psVar37[5].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar47,auVar75,auVar25);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = zeta3;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       *(ulong *)&(psVar37[2].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar1,auVar76,auVar26);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = zeta4;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       *(ulong *)&(psVar37[9].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar1,auVar77,auVar27);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,3,2)
  ;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       *(ulong *)((long)&(psVar37[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       zeta2 * *(double *)
                ((long)&(psVar37[8].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar48,auVar78,auVar28);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = zeta3;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       *(ulong *)((long)&(psVar37[9].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar1,auVar79,auVar29);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = zeta4;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(ulong *)((long)&(psVar37[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  auVar1 = vfmadd231sd_fma(auVar1,auVar80,auVar30);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,1,3)
  ;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       *(ulong *)&(psVar37[7].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       zeta2 * *(double *)
                &(psVar37[8].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar49,auVar81,auVar31);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = zeta3;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       *(ulong *)&(psVar37[9].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar1,auVar82,auVar32);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = zeta4;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       *(ulong *)&(psVar37[3].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x28;
  auVar1 = vfmadd231sd_fma(auVar1,auVar83,auVar33);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,2,3)
  ;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = zeta1;
  *pSVar38 = auVar1._0_8_ * 4.0;
  psVar37 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(ulong *)&(psVar37[7].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       zeta2 * *(double *)
                &(psVar37[8].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar50,auVar84,auVar34);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = zeta3;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       *(ulong *)&(psVar37[9].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar1,auVar85,auVar35);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = zeta4;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       *(ulong *)&(psVar37[3].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->field_0x30;
  auVar1 = vfmadd231sd_fma(auVar1,auVar86,auVar36);
  pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)Jacobian,3,3)
  ;
  *pSVar38 = auVar1._0_8_ * 4.0;
  return;
}

Assistant:

void ChElementTetraCorot_10::ComputeJacobian(ChMatrixDynamic<>& Jacobian,
                                             double zeta1,
                                             double zeta2,
                                             double zeta3,
                                             double zeta4) {
    Jacobian.setConstant(1);

    Jacobian(1, 0) = 4 * (nodes[0]->pos.x() * (zeta1 - 1 / 4) + nodes[4]->pos.x() * zeta2 + nodes[6]->pos.x() * zeta3 +
                          nodes[7]->pos.x() * zeta4);
    Jacobian(2, 0) = 4 * (nodes[0]->pos.y() * (zeta1 - 1 / 4) + nodes[4]->pos.y() * zeta2 + nodes[6]->pos.y() * zeta3 +
                          nodes[7]->pos.y() * zeta4);
    Jacobian(3, 0) = 4 * (nodes[0]->pos.z() * (zeta1 - 1 / 4) + nodes[4]->pos.z() * zeta2 + nodes[6]->pos.z() * zeta3 +
                          nodes[7]->pos.z() * zeta4);
    Jacobian(1, 1) = 4 * (nodes[4]->pos.x() * zeta1 + nodes[1]->pos.x() * (zeta2 - 1 / 4) + nodes[5]->pos.x() * zeta3 +
                          nodes[8]->pos.x() * zeta4);
    Jacobian(2, 1) = 4 * (nodes[4]->pos.y() * zeta1 + nodes[1]->pos.y() * (zeta2 - 1 / 4) + nodes[5]->pos.y() * zeta3 +
                          nodes[8]->pos.y() * zeta4);
    Jacobian(3, 1) = 4 * (nodes[4]->pos.z() * zeta1 + nodes[1]->pos.z() * (zeta2 - 1 / 4) + nodes[5]->pos.z() * zeta3 +
                          nodes[8]->pos.z() * zeta4);
    Jacobian(1, 2) = 4 * (nodes[6]->pos.x() * zeta1 + nodes[5]->pos.x() * zeta2 + nodes[2]->pos.x() * (zeta3 - 1 / 4) +
                          nodes[9]->pos.x() * zeta4);
    Jacobian(2, 2) = 4 * (nodes[6]->pos.y() * zeta1 + nodes[5]->pos.y() * zeta2 + nodes[2]->pos.y() * (zeta3 - 1 / 4) +
                          nodes[9]->pos.y() * zeta4);
    Jacobian(3, 2) = 4 * (nodes[6]->pos.z() * zeta1 + nodes[5]->pos.z() * zeta2 + nodes[2]->pos.z() * (zeta3 - 1 / 4) +
                          nodes[9]->pos.z() * zeta4);
    Jacobian(1, 3) = 4 * (nodes[7]->pos.x() * zeta1 + nodes[8]->pos.x() * zeta2 + nodes[9]->pos.x() * zeta3 +
                          nodes[3]->pos.x() * (zeta4 - 1 / 4));
    Jacobian(2, 3) = 4 * (nodes[7]->pos.y() * zeta1 + nodes[8]->pos.y() * zeta2 + nodes[9]->pos.y() * zeta3 +
                          nodes[3]->pos.y() * (zeta4 - 1 / 4));
    Jacobian(3, 3) = 4 * (nodes[7]->pos.z() * zeta1 + nodes[8]->pos.z() * zeta2 + nodes[9]->pos.z() * zeta3 +
                          nodes[3]->pos.z() * (zeta4 - 1 / 4));
}